

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<float,_4,_2>::Matrix(Matrix<float,_4,_2> *this,float *src)

{
  long lVar1;
  int row;
  long lVar2;
  long lVar3;
  float fVar4;
  
  Vector<tcu::Vector<float,_4>,_2>::Vector(&this->m_data);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 0x10) {
      if (lVar1 == lVar3) {
        fVar4 = *src;
      }
      else {
        fVar4 = 0.0;
      }
      *(float *)((long)this + lVar3) = fVar4;
    }
    this = (Matrix<float,_4,_2> *)((long)this + 4);
    lVar1 = lVar1 + 0x10;
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? src : T(0);
}